

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

bool __thiscall
el::base::RegisteredHitCounters::validateNTimes
          (RegisteredHitCounters *this,char *filename,LineNumber lineNumber,size_t n)

{
  HitCounter *pHVar1;
  ulong uVar2;
  char *filename_local;
  
  filename_local = filename;
  (*(this->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
    super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
    .super_ThreadSafe._vptr_ThreadSafe[2])();
  pHVar1 = utils::RegistryWithPred<el::base::HitCounter,el::base::HitCounter::Predicate>::
           get<char_const*,unsigned_long>
                     ((RegistryWithPred<el::base::HitCounter,el::base::HitCounter::Predicate> *)this
                      ,&filename_local,lineNumber);
  if (pHVar1 == (HitCounter *)0x0) {
    pHVar1 = (HitCounter *)operator_new(0x20);
    pHVar1->_vptr_HitCounter = (_func_int **)&PTR__HitCounter_001a0930;
    pHVar1->m_filename = filename_local;
    pHVar1->m_lineNumber = lineNumber;
    pHVar1->m_hitCounts = 0;
    (*(this->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
      super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
      .super_ThreadSafe._vptr_ThreadSafe[0x10])(this,pHVar1);
  }
  uVar2 = pHVar1->m_hitCounts + 1;
  pHVar1->m_hitCounts = uVar2;
  return uVar2 <= n;
}

Assistant:

bool RegisteredHitCounters::validateNTimes(const char* filename, base::type::LineNumber lineNumber, std::size_t n) {
  base::threading::ScopedLock scopedLock(lock());
  base::HitCounter* counter = get(filename, lineNumber);
  if (counter == nullptr) {
    registerNew(counter = new base::HitCounter(filename, lineNumber));
  }
  counter->increment();
  // Do not use validateHitCounts here since we do not want to reset counter here
  if (counter->hitCounts() <= n)
    return true;
  return false;
}